

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O2

int NGA_Locate_nnodes64(int g_a,int64_t *lo,int64_t *hi)

{
  Integer IVar1;
  Integer *pIVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  Integer np;
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer local_a0 [8];
  long lStack_60;
  Integer local_58 [8];
  
  IVar1 = pnga_ndim((long)g_a);
  lVar4 = 0;
  lVar3 = 0;
  if (0 < IVar1) {
    lVar3 = IVar1;
  }
  plVar5 = &lStack_60 + IVar1;
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *plVar5 = lo[lVar4] + 1;
    plVar5 = plVar5 + -1;
  }
  pIVar2 = local_a0 + IVar1;
  for (lVar4 = 0; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    *pIVar2 = hi[lVar4] + 1;
    pIVar2 = pIVar2 + -1;
  }
  pnga_locate_nnodes((long)g_a,local_58,local_a0 + 1,local_a0);
  return (int)local_a0[0];
}

Assistant:

int NGA_Locate_nnodes64(int g_a, int64_t lo[], int64_t hi[])
{
     /* logical st; */
     Integer a=(Integer)g_a, np;
     Integer ndim = wnga_ndim(a);
     Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];

     COPYINDEX_C2F(lo,_ga_lo,ndim);
     COPYINDEX_C2F(hi,_ga_hi,ndim);
     /* st = wnga_locate_nnodes(a, _ga_lo, _ga_hi, &np); */
     (void)wnga_locate_nnodes(a, _ga_lo, _ga_hi, &np);
     return (int)np;
}